

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall QGraphicsScene::event(QGraphicsScene *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  Int IVar4;
  int iVar5;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *pQVar6;
  QGraphicsScenePrivate *pQVar7;
  QGraphicsScenePrivate *in_RSI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar8;
  QGraphicsItem *item_1;
  QList<QGraphicsItem_*> *__range4;
  QGraphicsItem *lastActivePanel;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range5;
  QGraphicsSceneEvent *leaveEvent;
  QGraphicsSceneHoverEvent *hoverEvent;
  QGraphicsSceneMouseEvent *mouseEvent;
  QGraphicsItem *parent;
  bool res;
  QKeyEvent *k;
  QGraphicsScenePrivate *d;
  const_iterator __end4;
  const_iterator __begin4;
  QList<QGraphicsItem_*> items__1;
  QEvent event_2;
  const_iterator __end5;
  const_iterator __begin5;
  QList<QGraphicsItem_*> items_;
  QEvent event_1;
  KeyboardModifier in_stack_fffffffffffffe0c;
  QList<QGraphicsItem_*> *in_stack_fffffffffffffe10;
  QFlagsStorage<Qt::KeyboardModifier> other;
  QGraphicsScenePrivate *in_stack_fffffffffffffe18;
  QWidget *in_stack_fffffffffffffe20;
  QGraphicsItem *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  QRectF *in_stack_fffffffffffffe50;
  QGraphicsScene *in_stack_fffffffffffffe58;
  QGraphicsSceneHoverEvent *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint uVar9;
  undefined4 in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 duringActivationEvent;
  bool local_139;
  QRectF local_138;
  QTouchEvent *in_stack_fffffffffffffef8;
  QGraphicsScenePrivate *in_stack_ffffffffffffff00;
  QRectF local_f8;
  QRectF local_d8;
  QGraphicsItem **local_b8;
  const_iterator local_b0;
  const_iterator local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QGraphicsItem **local_78;
  const_iterator local_70;
  const_iterator local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  QPointF local_38;
  undefined1 in_stack_ffffffffffffffd8 [16];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  undefined4 local_10;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  duringActivationEvent = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9cddee);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (((TVar3 - GraphicsSceneMouseMove < 4) || (TVar3 - GraphicsSceneHoverEnter < 3)) ||
     (TVar3 - TouchBegin < 3)) {
    QList<QGraphicsItem_*>::clear(in_stack_fffffffffffffe10);
  }
  TVar3 = QEvent::type((QEvent *)in_RSI);
  pQVar7 = (QGraphicsScenePrivate *)(ulong)(TVar3 - KeyPress);
  switch(pQVar7) {
  case (QGraphicsScenePrivate *)0x0:
    pQVar7 = in_RSI;
    if (this_00->focusItem == (QGraphicsItem *)0x0) {
      iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
      other.i = (Int)in_stack_fffffffffffffe18;
      if ((iVar5 == 0x1000001) || (iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI), iVar5 == 0x1000002))
      {
        local_10 = QKeyEvent::modifiers();
        Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                      (enum_type)in_stack_fffffffffffffe10);
        local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorage<Qt::KeyboardModifier>)
             QFlags<Qt::KeyboardModifier>::operator&
                       ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffe10,
                        (QFlags<Qt::KeyboardModifier>)other.i);
        bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
        if (bVar1) {
          uVar9 = 0;
          iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
          bVar1 = true;
          if (iVar5 != 0x1000002) {
            iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
            bVar1 = false;
            if (iVar5 == 0x1000001) {
              QKeyEvent::modifiers();
              local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
                   (QFlagsStorage<Qt::KeyboardModifier>)
                   QFlags<Qt::KeyboardModifier>::operator&
                             ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffe10,
                              in_stack_fffffffffffffe0c);
              IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
              bVar1 = IVar4 != 0;
            }
          }
          if (bVar1) {
            bVar2 = (**(code **)(*(long *)in_RDI + 0x100))(in_RDI,0);
            uVar9 = (bVar2 & 1) << 0x18;
          }
          else {
            iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
            if (iVar5 == 0x1000001) {
              bVar2 = (**(code **)(*(long *)in_RDI + 0x100))(in_RDI,1);
              uVar9 = (bVar2 & 1) << 0x18;
            }
          }
          if ((uVar9 & 0x1000000) == 0) {
            QEvent::ignore((QEvent *)pQVar7);
          }
          local_139 = true;
          goto LAB_009ce8cb;
        }
      }
    }
    (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,pQVar7);
    break;
  case (QGraphicsScenePrivate *)0x1:
    (**(code **)(*(long *)in_RDI + 0xb0))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x2:
    (**(code **)(*(long *)in_RDI + 0x90))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x3:
    (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,in_RSI);
    break;
  default:
    bVar2 = QObject::event(in_RDI);
    local_139 = (bool)(bVar2 & 1);
    goto LAB_009ce8cb;
  case (QGraphicsScenePrivate *)0x5:
    break;
  case (QGraphicsScenePrivate *)0x12:
    iVar5 = this_00->activationRefCount;
    this_00->activationRefCount = iVar5 + 1;
    if (iVar5 == 0) {
      if (this_00->lastActivePanel == (QGraphicsItem *)0x0) {
        if ((this_00->tabFocusFirst == (QGraphicsWidget *)0x0) ||
           (bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9ce3e0), !bVar1)) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          QEvent::QEvent((QEvent *)&local_48,WindowActivate);
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          items((QGraphicsScene *)in_stack_fffffffffffffe28,
                (SortOrder)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          local_68.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = QList<QGraphicsItem_*>::begin(in_stack_fffffffffffffe10);
          local_70.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
          local_70 = QList<QGraphicsItem_*>::end(in_stack_fffffffffffffe10);
          while( true ) {
            local_78 = local_70.i;
            bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_68,local_70);
            if (!bVar1) break;
            QList<QGraphicsItem_*>::const_iterator::operator*(&local_68);
            bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9ce557);
            if (((bVar1) && (bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9ce567), !bVar1)) &&
               (pQVar6 = QGraphicsItem::parentItem((QGraphicsItem *)0x9ce575),
               pQVar6 == (QGraphicsItem *)0x0)) {
              sendEvent((QGraphicsScene *)
                        CONCAT17(in_stack_fffffffffffffe37,
                                 CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                        in_stack_fffffffffffffe28,(QEvent *)in_stack_fffffffffffffe20);
            }
            QList<QGraphicsItem_*>::const_iterator::operator++(&local_68);
          }
          QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ce5b3);
          QEvent::~QEvent((QEvent *)&local_48);
        }
        else {
          QGraphicsScenePrivate::setActivePanelHelper
                    (in_RSI,(QGraphicsItem *)this_00,(bool)duringActivationEvent);
        }
      }
      else {
        QGraphicsScenePrivate::setActivePanelHelper
                  (in_RSI,(QGraphicsItem *)this_00,(bool)duringActivationEvent);
      }
    }
    break;
  case (QGraphicsScenePrivate *)0x13:
    iVar5 = this_00->activationRefCount + -1;
    this_00->activationRefCount = iVar5;
    if (iVar5 == 0) {
      if (this_00->activePanel == (QGraphicsItem *)0x0) {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_88,WindowDeactivate);
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        items((QGraphicsScene *)in_stack_fffffffffffffe28,
              (SortOrder)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        local_a8.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_a8 = QList<QGraphicsItem_*>::begin(in_stack_fffffffffffffe10);
        local_b0.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_b0 = QList<QGraphicsItem_*>::end(in_stack_fffffffffffffe10);
        while( true ) {
          local_b8 = local_b0.i;
          bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_a8,local_b0);
          if (!bVar1) break;
          QList<QGraphicsItem_*>::const_iterator::operator*(&local_a8);
          bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9ce75a);
          if (((bVar1) && (bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9ce76a), !bVar1)) &&
             (pQVar6 = QGraphicsItem::parentItem((QGraphicsItem *)0x9ce778),
             pQVar6 == (QGraphicsItem *)0x0)) {
            sendEvent((QGraphicsScene *)
                      CONCAT17(in_stack_fffffffffffffe37,
                               CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                      in_stack_fffffffffffffe28,(QEvent *)in_stack_fffffffffffffe20);
          }
          QList<QGraphicsItem_*>::const_iterator::operator++(&local_a8);
        }
        QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ce7b6);
        QEvent::~QEvent((QEvent *)&local_88);
      }
      else {
        pQVar6 = this_00->activePanel;
        QGraphicsScenePrivate::setActivePanelHelper
                  (in_RSI,(QGraphicsItem *)this_00,(bool)duringActivationEvent);
        this_00->lastActivePanel = pQVar6;
      }
    }
    break;
  case (QGraphicsScenePrivate *)0x1e:
    QGraphicsScenePrivate::resolveFont(in_stack_fffffffffffffe18);
    break;
  case (QGraphicsScenePrivate *)0x20:
    QGraphicsScenePrivate::resolvePalette(in_stack_fffffffffffffe18);
    break;
  case (QGraphicsScenePrivate *)0x21:
    QRectF::QRectF(&local_f8);
    update(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    break;
  case (QGraphicsScenePrivate *)0x2d:
    pQVar6 = focusItem((QGraphicsScene *)in_stack_fffffffffffffe20);
    while (pQVar6 != (QGraphicsItem *)0x0) {
      QGraphicsScenePrivate::sendEvent
                (pQVar7,(QGraphicsItem *)
                        CONCAT17(in_stack_fffffffffffffe37,
                                 CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                 (QEvent *)in_stack_fffffffffffffe28);
      bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
      if (bVar1) {
        local_139 = true;
        goto LAB_009ce8cb;
      }
      pQVar6 = QGraphicsItem::parentItem((QGraphicsItem *)0x9ce15c);
    }
    local_139 = false;
    goto LAB_009ce8cb;
  case (QGraphicsScenePrivate *)0x4d:
    (**(code **)(*(long *)in_RDI + 0xe0))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x5b:
    QRectF::QRectF(&local_d8);
    update(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    break;
  case (QGraphicsScenePrivate *)0x5e:
    QRectF::QRectF((QRectF *)&stack0xfffffffffffffee8);
    update(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    break;
  case (QGraphicsScenePrivate *)0x95:
    QVar8 = QGraphicsSceneMouseEvent::scenePos
                      ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffe18);
    (this_00->lastSceneMousePos).xp = QVar8.xp;
    (this_00->lastSceneMousePos).yp = QVar8.yp;
    (**(code **)(*(long *)in_RDI + 0xc0))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x96:
    (**(code **)(*(long *)in_RDI + 0xb8))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x97:
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x98:
    (**(code **)(*(long *)in_RDI + 0xd0))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x99:
    (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x9a:
  case (QGraphicsScenePrivate *)0x9b:
  case (QGraphicsScenePrivate *)0x9c:
    local_38 = QGraphicsSceneHoverEvent::scenePos
                         ((QGraphicsSceneHoverEvent *)in_stack_fffffffffffffe18);
    (this_00->lastSceneMousePos).xp = local_38.xp;
    (this_00->lastSceneMousePos).yp = local_38.yp;
    QGraphicsScenePrivate::dispatchHoverEvent
              ((QGraphicsScenePrivate *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90);
    break;
  case (QGraphicsScenePrivate *)0x9d:
    (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x9e:
    (**(code **)(*(long *)in_RDI + 0x70))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0x9f:
    (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0xa0:
    (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0xa1:
    (**(code **)(*(long *)in_RDI + 0x88))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0xa2:
    (**(code **)(*(long *)in_RDI + 0xd8))(in_RDI,in_RSI);
    break;
  case (QGraphicsScenePrivate *)0xbc:
  case (QGraphicsScenePrivate *)0xbd:
  case (QGraphicsScenePrivate *)0xbe:
    QGraphicsScenePrivate::touchEventHandler(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    break;
  case (QGraphicsScenePrivate *)0xc0:
  case (QGraphicsScenePrivate *)0xc4:
    QGraphicsScenePrivate::gestureEventHandler
              (in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_);
    break;
  case (QGraphicsScenePrivate *)0xcf:
    QRectF::QRectF(&local_138);
    update(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    break;
  case (QGraphicsScenePrivate *)0xd6:
    QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9ce314);
    QGraphicsScenePrivate::leaveScene(this_00,in_stack_fffffffffffffe20);
  }
  local_139 = true;
LAB_009ce8cb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_139;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScene::event(QEvent *event)
{
    Q_D(QGraphicsScene);

    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        // Reset the under-mouse list to ensure that this event gets fresh
        // item-under-mouse data. Be careful about this list; if people delete
        // items from inside event handlers, this list can quickly end up
        // having stale pointers in it. We need to clear it before dispatching
        // events that use it.
        // ### this should only be cleared if we received a new mouse move event,
        // which relies on us fixing the replay mechanism in QGraphicsView.
        d->cachedItemsUnderMouse.clear();
        break;
    default:
        break;
    }

    switch (event->type()) {
    case QEvent::GraphicsSceneDragEnter:
        dragEnterEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDragMove:
        dragMoveEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDragLeave:
        dragLeaveEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneDrop:
        dropEvent(static_cast<QGraphicsSceneDragDropEvent *>(event));
        break;
    case QEvent::GraphicsSceneContextMenu:
        contextMenuEvent(static_cast<QGraphicsSceneContextMenuEvent *>(event));
        break;
    case QEvent::KeyPress:
        if (!d->focusItem) {
            QKeyEvent *k = static_cast<QKeyEvent *>(event);
            if (k->key() == Qt::Key_Tab || k->key() == Qt::Key_Backtab) {
                if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
                    bool res = false;
                    if (k->key() == Qt::Key_Backtab
                        || (k->key() == Qt::Key_Tab && (k->modifiers() & Qt::ShiftModifier))) {
                        res = focusNextPrevChild(false);
                    } else if (k->key() == Qt::Key_Tab) {
                        res = focusNextPrevChild(true);
                    }
                    if (!res)
                        event->ignore();
                    return true;
                }
            }
        }
        keyPressEvent(static_cast<QKeyEvent *>(event));
        break;
    case QEvent::KeyRelease:
        keyReleaseEvent(static_cast<QKeyEvent *>(event));
        break;
    case QEvent::ShortcutOverride: {
            QGraphicsItem *parent = focusItem();
            while (parent) {
                d->sendEvent(parent, event);
                if (event->isAccepted())
                    return true;
                parent = parent->parentItem();
            }
        }
        return false;
    case QEvent::GraphicsSceneMouseMove:
    {
        QGraphicsSceneMouseEvent *mouseEvent = static_cast<QGraphicsSceneMouseEvent *>(event);
        d->lastSceneMousePos = mouseEvent->scenePos();
        mouseMoveEvent(mouseEvent);
        break;
    }
    case QEvent::GraphicsSceneMousePress:
        mousePressEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneMouseRelease:
        mouseReleaseEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        mouseDoubleClickEvent(static_cast<QGraphicsSceneMouseEvent *>(event));
        break;
    case QEvent::GraphicsSceneWheel:
        wheelEvent(static_cast<QGraphicsSceneWheelEvent *>(event));
        break;
    case QEvent::FocusIn:
        focusInEvent(static_cast<QFocusEvent *>(event));
        break;
    case QEvent::FocusOut:
        focusOutEvent(static_cast<QFocusEvent *>(event));
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHoverMove:
    {
        QGraphicsSceneHoverEvent *hoverEvent = static_cast<QGraphicsSceneHoverEvent *>(event);
        d->lastSceneMousePos = hoverEvent->scenePos();
        d->dispatchHoverEvent(hoverEvent);
        break;
    }
    case QEvent::Leave:
        Q_ASSERT_X(false, "QGraphicsScene::event",
                   "QGraphicsScene must not receive QEvent::Leave, use GraphicsSceneLeave");
        break;
    case QEvent::GraphicsSceneLeave:
    {
        auto *leaveEvent = static_cast<QGraphicsSceneEvent*>(event);
        d->leaveScene(leaveEvent->widget());
        break;
    }
    case QEvent::GraphicsSceneHelp:
        helpEvent(static_cast<QGraphicsSceneHelpEvent *>(event));
        break;
    case QEvent::InputMethod:
        inputMethodEvent(static_cast<QInputMethodEvent *>(event));
        break;
    case QEvent::WindowActivate:
        if (!d->activationRefCount++) {
            if (d->lastActivePanel) {
                // Activate the last panel.
                d->setActivePanelHelper(d->lastActivePanel, true);
            } else if (d->tabFocusFirst && d->tabFocusFirst->isPanel()) {
                // Activate the panel of the first item in the tab focus
                // chain.
                d->setActivePanelHelper(d->tabFocusFirst, true);
            } else {
                // Activate all toplevel items.
                QEvent event(QEvent::WindowActivate);
                const auto items_ = items();
                for (QGraphicsItem *item : items_) {
                    if (item->isVisible() && !item->isPanel() && !item->parentItem())
                        sendEvent(item, &event);
                }
            }
        }
        break;
    case QEvent::WindowDeactivate:
        if (!--d->activationRefCount) {
            if (d->activePanel) {
                // Deactivate the active panel (but keep it so we can
                // reactivate it later).
                QGraphicsItem *lastActivePanel = d->activePanel;
                d->setActivePanelHelper(nullptr, true);
                d->lastActivePanel = lastActivePanel;
            } else {
                // Activate all toplevel items.
                QEvent event(QEvent::WindowDeactivate);
                const auto items_ = items();
                for (QGraphicsItem *item : items_) {
                    if (item->isVisible() && !item->isPanel() && !item->parentItem())
                        sendEvent(item, &event);
                }
            }
        }
        break;
    case QEvent::ApplicationFontChange: {
        // Resolve the existing scene font.
        d->resolveFont();
        break;
    }
    case QEvent::FontChange:
        // Update the entire scene when the font changes.
        update();
        break;
    case QEvent::ApplicationPaletteChange: {
        // Resolve the existing scene palette.
        d->resolvePalette();
        break;
    }
    case QEvent::PaletteChange:
        // Update the entire scene when the palette changes.
        update();
        break;
    case QEvent::StyleChange:
        // Reresolve all widgets' styles. Update all top-level widgets'
        // geometries that do not have an explicit style set.
        update();
        break;
    case QEvent::StyleAnimationUpdate:
        // Because QGraphicsItem is not a QObject, QStyle driven
        // animations are forced to update the whole scene
        update();
        break;
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        d->touchEventHandler(static_cast<QTouchEvent *>(event));
        break;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    case QEvent::GestureOverride:
        d->gestureEventHandler(static_cast<QGestureEvent *>(event));
        break;
#endif // QT_NO_GESTURES
    default:
        return QObject::event(event);
    }
    return true;
}